

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O3

void __thiscall
tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
          (ConstPixelBufferAccess *this,TextureFormat *format,int width,int height,int depth,
          void *data)

{
  TextureFormat format_00;
  int iVar1;
  
  format_00 = *format;
  this->m_format = format_00;
  (this->m_size).m_data[0] = width;
  (this->m_size).m_data[1] = height;
  (this->m_size).m_data[2] = depth;
  iVar1 = getPixelSize(format_00);
  (this->m_pitch).m_data[0] = iVar1;
  (this->m_pitch).m_data[1] = width * iVar1;
  (this->m_pitch).m_data[2] = height * width * iVar1;
  this->m_data = data;
  return;
}

Assistant:

ConstPixelBufferAccess::ConstPixelBufferAccess (const TextureFormat& format, int width, int height, int depth, const void* data)
	: m_format		(format)
	, m_size		(width, height, depth)
	, m_pitch		(calculatePackedPitch(m_format, m_size))
	, m_data		((void*)data)
{
	DE_ASSERT(isValid(format));
}